

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint lower;
  Cudd_AggregationType CVar1;
  MtrHalfWord MVar2;
  MtrHalfWord MVar3;
  DdSubtable *pDVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  code *pcVar8;
  long lVar9;
  int upper;
  MtrNode *pMVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  iVar7 = table->size;
  if (iVar7 <= (int)treenode->low) {
    return 1;
  }
  lower = table->perm[treenode->index];
  upper = treenode->size + lower + -1;
  if (iVar7 <= upper) {
    pMVar10 = treenode->child;
    if (pMVar10 == (MtrNode *)0x0) {
      upper = iVar7 + -1;
    }
    else {
      upper = -1;
      do {
        iVar16 = table->perm[pMVar10->low];
        iVar14 = iVar16 + -1;
        if ((int)(pMVar10->size + iVar14) < iVar7) {
          iVar14 = upper;
        }
        if (iVar16 < iVar7) {
          upper = iVar14;
        }
        pMVar10 = pMVar10->younger;
      } while (pMVar10 != (MtrNode *)0x0);
    }
  }
  if (upper == -1) {
    return 1;
  }
  iVar7 = 1;
  if (treenode->flags == 4) goto LAB_0091e129;
  switch(method) {
  case CUDD_REORDER_RANDOM:
  case CUDD_REORDER_RANDOM_PIVOT:
    iVar7 = cuddSwapping(table,lower,upper,method);
    break;
  case CUDD_REORDER_SIFT:
    iVar7 = cuddSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SIFT_CONVERGE:
    uVar17 = table->keys;
    iVar16 = table->isolated;
    do {
      uVar18 = uVar17 - iVar16;
      iVar7 = cuddSifting(table,lower,upper);
      uVar17 = table->keys;
      iVar16 = table->isolated;
      if (uVar18 <= uVar17 - iVar16) break;
    } while (iVar7 != 0);
    break;
  case CUDD_REORDER_SYMM_SIFT:
    iVar7 = cuddSymmSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SYMM_SIFT_CONV:
    iVar7 = cuddSymmSiftingConv(table,lower,upper);
    break;
  case CUDD_REORDER_WINDOW2:
  case CUDD_REORDER_WINDOW3:
  case CUDD_REORDER_WINDOW4:
  case CUDD_REORDER_WINDOW2_CONV:
  case CUDD_REORDER_WINDOW3_CONV:
  case CUDD_REORDER_WINDOW4_CONV:
    iVar7 = cuddWindowReorder(table,lower,upper,method);
    break;
  case CUDD_REORDER_GROUP_SIFT:
    CVar1 = table->groupcheck;
    if ((CVar1 == CUDD_GROUP_CHECK7) || (CVar1 == CUDD_GROUP_CHECK5)) {
      pcVar8 = ddExtSymmCheck;
    }
    else {
      if (CVar1 != CUDD_NO_CHECK) {
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
        iVar7 = 0;
        break;
      }
      pcVar8 = ddNoCheck;
    }
    iVar7 = 0;
    goto LAB_0091e124;
  case CUDD_REORDER_GROUP_SIFT_CONV:
    uVar17 = table->keys;
    iVar16 = table->isolated;
    do {
      CVar1 = table->groupcheck;
      if ((CVar1 == CUDD_GROUP_CHECK7) || (CVar1 == CUDD_GROUP_CHECK5)) {
        pcVar8 = ddExtSymmCheck;
LAB_0091df66:
        ddGroupSifting(table,lower,upper,pcVar8,0);
      }
      else {
        if (CVar1 == CUDD_NO_CHECK) {
          pcVar8 = ddNoCheck;
          goto LAB_0091df66;
        }
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
      }
      uVar18 = uVar17 - iVar16;
      iVar7 = cuddWindowReorder(table,lower,upper,CUDD_REORDER_WINDOW4);
      uVar17 = table->keys;
      iVar16 = table->isolated;
    } while ((uVar17 - iVar16 < uVar18) && (iVar7 != 0));
    break;
  case CUDD_REORDER_ANNEALING:
    iVar7 = cuddAnnealing(table,lower,upper);
    break;
  case CUDD_REORDER_GENETIC:
    iVar7 = cuddGa(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR:
    iVar7 = cuddLinearAndSifting(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR_CONVERGE:
    uVar17 = table->keys;
    iVar16 = table->isolated;
    do {
      uVar18 = uVar17 - iVar16;
      iVar7 = cuddLinearAndSifting(table,lower,upper);
      uVar17 = table->keys;
      iVar16 = table->isolated;
      if (uVar18 <= uVar17 - iVar16) break;
    } while (iVar7 != 0);
    break;
  case CUDD_REORDER_LAZY_SIFT:
    pcVar8 = ddVarGroupCheck;
    iVar7 = 1;
LAB_0091e124:
    iVar7 = ddGroupSifting(table,lower,upper,pcVar8,iVar7);
    break;
  case CUDD_REORDER_EXACT:
    iVar7 = cuddExact(table,lower,upper);
    break;
  default:
    return 0;
  }
LAB_0091e129:
  auVar6 = _DAT_0093d220;
  auVar5 = _DAT_0093d210;
  lVar9 = (long)(int)lower;
  if (table->tree != treenode) {
    pDVar4 = table->subtables;
    if ((int)lower < upper) {
      lVar11 = upper - lVar9;
      lVar12 = lVar11 + -1;
      auVar19._0_8_ = (long)(int)lower;
      auVar19._8_4_ = lower;
      auVar19._12_4_ = (int)lower >> 0x1f;
      lVar20 = auVar19._8_8_ + 1;
      auVar21._8_4_ = (int)lVar12;
      auVar21._0_8_ = lVar12;
      auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
      puVar13 = &pDVar4[lVar9 + 1].next;
      uVar15 = 0;
      auVar21 = auVar21 ^ _DAT_0093d220;
      do {
        auVar22._8_4_ = (int)uVar15;
        auVar22._0_8_ = uVar15;
        auVar22._12_4_ = (int)(uVar15 >> 0x20);
        auVar22 = (auVar22 | auVar5) ^ auVar6;
        if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                    auVar21._4_4_ < auVar22._4_4_) & 1)) {
          puVar13[-0xe] = (int)(auVar19._0_8_ + 1);
        }
        if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
            auVar22._12_4_ <= auVar21._12_4_) {
          *puVar13 = (uint)(lVar20 + 1);
        }
        uVar15 = uVar15 + 2;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        lVar20 = lVar20 + 2;
        puVar13 = puVar13 + 0x1c;
      } while ((lVar11 + 1U & 0xfffffffffffffffe) != uVar15);
    }
    pDVar4[upper].next = lower;
  }
  MVar2 = treenode->index;
  MVar3 = table->invperm[lVar9];
  do {
    treenode->index = MVar3;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar7;
    }
  } while (treenode->index == MVar2);
  return iVar7;
}

Assistant:

static int
ddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    ddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            if (table->groupcheck == CUDD_NO_CHECK) {
                result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else {
                (void) fprintf(table->err,
                               "Unknown group ckecking method\n");
                result = 0;
            }
            break;
        case CUDD_REORDER_GROUP_SIFT_CONV:
            do {
                initialSize = table->keys - table->isolated;
                if (table->groupcheck == CUDD_NO_CHECK) {
                    result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else {
                    (void) fprintf(table->err,
                                   "Unknown group ckecking method\n");
                    result = 0;
                }
#ifdef DD_STATS
                (void) fprintf(table->out,"\n");
#endif
                result = cuddWindowReorder(table,lower,upper,
                                           CUDD_REORDER_WINDOW4);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_WINDOW2:
        case CUDD_REORDER_WINDOW3:
        case CUDD_REORDER_WINDOW4:
        case CUDD_REORDER_WINDOW2_CONV:
        case CUDD_REORDER_WINDOW3_CONV:
        case CUDD_REORDER_WINDOW4_CONV:
            result = cuddWindowReorder(table,lower,upper,method);
            break;
        case CUDD_REORDER_ANNEALING:
            result = cuddAnnealing(table,lower,upper);
            break;
        case CUDD_REORDER_GENETIC:
            result = cuddGa(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddLinearAndSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddLinearAndSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_EXACT:
            result = cuddExact(table,lower,upper);
            break;
        case CUDD_REORDER_LAZY_SIFT:
            result = ddGroupSifting(table,lower,upper,ddVarGroupCheck,
                                    DD_LAZY_SIFT);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of ddGroupSifting.
    */
    ddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddReorderChildren:");
#endif

    return(result);

}